

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<float,int,float,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool,false,true>
               (float *ldata,int *rdata,float *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  int iVar1;
  unsigned_long *puVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  float fVar11;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar1 = *rdata;
      iVar9 = 0;
      do {
        fVar11 = ldata[iVar9];
        if (iVar1 < 0) {
          dVar3 = pow(10.0,(double)-(float)iVar1);
          dVar4 = round((double)fVar11 / dVar3);
          dVar4 = dVar4 * dVar3;
          fVar11 = 0.0;
        }
        else {
          dVar3 = pow(10.0,(double)iVar1);
          dVar4 = round((double)fVar11 * dVar3);
          dVar4 = dVar4 / dVar3;
        }
        if ((ulong)ABS(dVar4) < 0x7ff0000000000000) {
          fVar11 = (float)dVar4;
        }
        result_data[iVar9] = fVar11;
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar8 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar2[uVar5];
      }
      uVar6 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar6 = count;
      }
      uVar10 = uVar6;
      if (uVar7 != 0) {
        uVar10 = uVar8;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar8 < uVar6) {
            iVar1 = *rdata;
            do {
              fVar11 = ldata[uVar8];
              if (iVar1 < 0) {
                dVar3 = pow(10.0,(double)-(float)iVar1);
                dVar4 = round((double)fVar11 / dVar3);
                dVar4 = dVar4 * dVar3;
                fVar11 = 0.0;
              }
              else {
                dVar3 = pow(10.0,(double)iVar1);
                dVar4 = round((double)fVar11 * dVar3);
                dVar4 = dVar4 / dVar3;
              }
              if ((ulong)ABS(dVar4) < 0x7ff0000000000000) {
                fVar11 = (float)dVar4;
              }
              result_data[uVar8] = fVar11;
              uVar8 = uVar8 + 1;
              uVar10 = uVar8;
            } while (uVar6 != uVar8);
          }
        }
        else if (uVar8 < uVar6) {
          uVar10 = 0;
          do {
            if ((uVar7 >> (uVar10 & 0x3f) & 1) != 0) {
              fVar11 = ldata[uVar8 + uVar10];
              iVar1 = *rdata;
              if (iVar1 < 0) {
                dVar3 = pow(10.0,(double)-(float)iVar1);
                dVar4 = round((double)fVar11 / dVar3);
                dVar4 = dVar4 * dVar3;
                fVar11 = 0.0;
              }
              else {
                dVar3 = pow(10.0,(double)iVar1);
                dVar4 = round((double)fVar11 * dVar3);
                dVar4 = dVar4 / dVar3;
              }
              if ((ulong)ABS(dVar4) < 0x7ff0000000000000) {
                fVar11 = (float)dVar4;
              }
              result_data[uVar8 + uVar10] = fVar11;
            }
            uVar10 = uVar10 + 1;
          } while ((uVar8 - uVar6) + uVar10 != 0);
          uVar10 = uVar8 + uVar10;
        }
      }
      uVar5 = uVar5 + 1;
      uVar8 = uVar10;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}